

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::DoConcatenation(ParseState *this)

{
  bool bVar1;
  RegexpOp op;
  Regexp *this_00;
  size_t in_stack_ffffffffffffffe0;
  Regexp *re;
  Regexp *r1;
  ParseState *this_local;
  
  if (this->stacktop_ != (Regexp *)0x0) {
    op = Regexp::op(this->stacktop_);
    bVar1 = IsMarker(this,op);
    if (!bVar1) goto LAB_00367ae6;
  }
  this_00 = (Regexp *)operator_new(in_stack_ffffffffffffffe0);
  Regexp(this_00,kRegexpEmptyMatch,this->flags_);
  PushRegexp(this,this_00);
LAB_00367ae6:
  DoCollapse(this,kRegexpConcat);
  return;
}

Assistant:

void Regexp::ParseState::DoConcatenation() {
  Regexp* r1 = stacktop_;
  if (r1 == NULL || IsMarker(r1->op())) {
    // empty concatenation is special case
    Regexp* re = new Regexp(kRegexpEmptyMatch, flags_);
    PushRegexp(re);
  }
  DoCollapse(kRegexpConcat);
}